

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::productTranspose
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result,
          vector<double,_std::allocator<double>_> *col)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  HighsSparseMatrix *in_RDI;
  HighsInt iEl_1;
  HighsInt iRow;
  HighsInt iEl;
  HighsInt iCol;
  size_type in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  value_type vVar7;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  std::vector<double,_std::allocator<double>_>::assign
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(value_type_conflict1 *)0x7eb819);
  bVar3 = isColwise(in_RDI);
  if (bVar3) {
    for (local_24 = 0; local_24 < in_RDI->num_col_; local_24 = local_24 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_24);
      for (local_28 = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_24 + 1)), local_28 < *pvVar4;
          local_28 = local_28 + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_28);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)*pvVar4);
        dVar2 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->value_,(long)local_28);
        dVar1 = *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_24);
        *pvVar6 = dVar2 * dVar1 + *pvVar6;
      }
    }
  }
  else {
    for (local_2c = 0; local_2c < in_RDI->num_row_; local_2c = local_2c + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_2c);
      for (local_30 = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_2c + 1)), local_30 < *pvVar4;
          local_30 = local_30 + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_2c);
        vVar7 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->value_,(long)local_30);
        dVar2 = *pvVar5;
        this_00 = in_RSI;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_30);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar4);
        *pvVar6 = vVar7 * dVar2 + *pvVar6;
      }
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::productTranspose(vector<double>& result,
                                         const vector<double>& col) const {
  assert(this->formatOk());
  assert((int)col.size() >= this->num_row_);
  result.assign(this->num_col_, 0.0);
  if (this->isColwise()) {
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        result[iCol] += col[this->index_[iEl]] * this->value_[iEl];
    }
  } else {
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++)
        result[this->index_[iEl]] += col[iRow] * this->value_[iEl];
    }
  }
}